

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O1

bool __thiscall Mapper::mapOpcode(Mapper *this,string *opcodeName,AssemberInstruction *instruction)

{
  uint uVar1;
  mapped_type *pmVar2;
  
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,opcodeName);
  uVar1 = pmVar2->second;
  instruction->opcode = pmVar2->first;
  instruction->operands = uVar1;
  return true;
}

Assistant:

bool Mapper::mapOpcode(std::string opcodeName, AssemberInstruction&instruction) {
	try {
		std::pair<unsigned char, unsigned int> opcode = opcodeMap[opcodeName];
		instruction.opcode = opcode.first;
		instruction.operands = opcode.second;
		return true;
	}
	catch (std::out_of_range) {
		return false;
	}
}